

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pe.cc
# Opt level: O2

bool __thiscall bloaty::pe::PeFile::Initialize(PeFile *this)

{
  short sVar1;
  ushort uVar2;
  char *pcVar3;
  char *pcVar4;
  undefined8 uVar5;
  undefined8 uVar6;
  undefined8 uVar7;
  undefined8 uVar8;
  undefined8 uVar9;
  undefined8 uVar10;
  undefined8 uVar11;
  undefined8 uVar12;
  bool bVar13;
  uint64_t uVar14;
  uint64_t uVar15;
  ulong uVar16;
  string_view sVar17;
  
  if ((this->data_)._M_len < 0x40) {
    return false;
  }
  pcVar3 = (this->data_)._M_str;
  uVar5 = *(undefined8 *)pcVar3;
  uVar6 = *(undefined8 *)(pcVar3 + 8);
  uVar7 = *(undefined8 *)(pcVar3 + 0x10);
  uVar8 = *(undefined8 *)(pcVar3 + 0x18);
  uVar9 = *(undefined8 *)(pcVar3 + 0x20);
  uVar10 = *(undefined8 *)(pcVar3 + 0x28);
  uVar11 = *(undefined8 *)(pcVar3 + 0x30);
  uVar12 = *(undefined8 *)(pcVar3 + 0x38);
  (this->dos_header_).Magic = (short)uVar5;
  (this->dos_header_).UsedBytesInTheLastPage = (short)((ulong)uVar5 >> 0x10);
  (this->dos_header_).FileSizeInPages = (short)((ulong)uVar5 >> 0x20);
  (this->dos_header_).NumberOfRelocationItems = (short)((ulong)uVar5 >> 0x30);
  (this->dos_header_).HeaderSizeInParagraphs = (short)uVar6;
  (this->dos_header_).MinimumExtraParagraphs = (short)((ulong)uVar6 >> 0x10);
  (this->dos_header_).MaximumExtraParagraphs = (short)((ulong)uVar6 >> 0x20);
  (this->dos_header_).InitialRelativeSS = (short)((ulong)uVar6 >> 0x30);
  (this->dos_header_).InitialSP = (short)uVar7;
  (this->dos_header_).Checksum = (short)((ulong)uVar7 >> 0x10);
  (this->dos_header_).InitialIP = (short)((ulong)uVar7 >> 0x20);
  (this->dos_header_).InitialRelativeCS = (short)((ulong)uVar7 >> 0x30);
  (this->dos_header_).AddressOfRelocationTable = (short)uVar8;
  (this->dos_header_).OverlayNumber = (short)((ulong)uVar8 >> 0x10);
  (this->dos_header_).Reserved[0] = (short)((ulong)uVar8 >> 0x20);
  (this->dos_header_).Reserved[1] = (short)((ulong)uVar8 >> 0x30);
  *(undefined8 *)((this->dos_header_).Reserved + 2) = uVar9;
  *(undefined8 *)(this->dos_header_).Reserved2 = uVar10;
  *(undefined8 *)((this->dos_header_).Reserved2 + 4) = uVar11;
  *(undefined8 *)((this->dos_header_).Reserved2 + 8) = uVar12;
  if ((this->dos_header_).Magic == 0x5a4d) {
    uVar14 = CheckedAdd((ulong)(this->dos_header_).AddressOfNewExeHeader,0x18);
    uVar15 = CheckedAdd(uVar14,2);
    if (uVar15 <= (this->data_)._M_len) {
      pcVar4 = (this->data_)._M_str;
      uVar16 = (ulong)(this->dos_header_).AddressOfNewExeHeader;
      pcVar3 = pcVar4 + uVar16;
      uVar5 = *(undefined8 *)pcVar3;
      uVar6 = *(undefined8 *)(pcVar3 + 8);
      (this->pe_header_).signature[0] = (char)uVar5;
      (this->pe_header_).signature[1] = (char)((ulong)uVar5 >> 8);
      (this->pe_header_).signature[2] = (char)((ulong)uVar5 >> 0x10);
      (this->pe_header_).signature[3] = (char)((ulong)uVar5 >> 0x18);
      (this->pe_header_).Machine = (short)((ulong)uVar5 >> 0x20);
      (this->pe_header_).NumberOfSections = (short)((ulong)uVar5 >> 0x30);
      (this->pe_header_).TimeDateStamp = (int)uVar6;
      (this->pe_header_).PointerToSymbolTable = (int)((ulong)uVar6 >> 0x20);
      uVar5 = *(undefined8 *)(pcVar4 + uVar16 + 0x10);
      (this->pe_header_).NumberOfSymbols = (int)uVar5;
      (this->pe_header_).SizeOfOptionalHeader = (short)((ulong)uVar5 >> 0x20);
      (this->pe_header_).Characteristics = (short)((ulong)uVar5 >> 0x30);
      bVar13 = std::__equal<true>::equal<char>
                         ((this->pe_header_).signature,(char *)&(this->pe_header_).Machine,"PE");
      if ((bVar13) &&
         ((sVar1 = *(short *)((this->data_)._M_str + uVar14), sVar1 == 0x20b || (sVar1 == 0x10b))))
      {
        this->is_64bit_ = sVar1 == 0x20b;
        uVar2 = (this->pe_header_).NumberOfSections;
        this->section_count_ = (uint)uVar2;
        uVar16 = (ulong)((this->dos_header_).AddressOfNewExeHeader + 0x18 +
                        (uint)(this->pe_header_).SizeOfOptionalHeader);
        uVar14 = CheckedMul((ulong)uVar2,0x28);
        if (uVar14 + uVar16 <= (this->data_)._M_len) {
          sVar17 = GetRegion(this,0,uVar16);
          this->pe_headers_ = sVar17;
          sVar17 = GetRegion(this,uVar16,uVar14);
          this->section_headers_ = sVar17;
          return true;
        }
      }
    }
  }
  return false;
}

Assistant:

bool PeFile::Initialize() {
  if (data_.size() < sizeof(dos_header_)) {
    return false;
  }

  memcpy(&dos_header_, data_.data(), sizeof(dos_header_));

  if (dos_header_.Magic != dos_magic) {
    // Not a PE file.
    return false;
  }

  PE_TYPE Magic;
  auto pe_end =
      CheckedAdd(dos_header_.AddressOfNewExeHeader, sizeof(pe_header_));
  if (CheckedAdd(pe_end, sizeof(Magic)) > data_.size()) {
    // Cannot fit the headers / magic from optional header
    return false;
  }

  memcpy(&pe_header_, data_.data() + dos_header_.AddressOfNewExeHeader,
         sizeof(pe_header_));

  if (!std::equal(pe_header_.signature, pe_header_.signature + sizeof(PE_Magic),
                  std::begin(PE_Magic))) {
    // Not a PE file.
    return false;
  }

  memcpy(&Magic, data_.data() + pe_end, sizeof(Magic));

  if (Magic != PE_TYPE::PE32 && Magic != PE_TYPE::PE32_PLUS) {
    // Unknown PE magic
    return false;
  }

  is_64bit_ = Magic == PE_TYPE::PE32_PLUS;

  section_count_ = pe_header_.NumberOfSections;

  // TODO(mj): Figure out if we should trust SizeOfOptionalHeader here
  const uint32_t sections_offset = dos_header_.AddressOfNewExeHeader +
                                   sizeof(pe_header_) +
                                   pe_header_.SizeOfOptionalHeader;

  auto sections_size = CheckedMul(section_count_, sizeof(pe_section));
  if ((sections_offset + sections_size) > data_.size()) {
    // Cannot fit the headers
    return false;
  }

  pe_headers_ = GetRegion(0, sections_offset);
  section_headers_ = GetRegion(sections_offset, sections_size);

  return true;
}